

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::~MeshEdgebreakerTraversalValenceEncoder
          (MeshEdgebreakerTraversalValenceEncoder *this)

{
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->context_symbols_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&this->vertex_valences_);
  std::
  _Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ::~_Vector_base((_Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   *)&this->corner_to_vertex_map_);
  MeshEdgebreakerTraversalEncoder::~MeshEdgebreakerTraversalEncoder
            (&this->super_MeshEdgebreakerTraversalEncoder);
  return;
}

Assistant:

MeshEdgebreakerTraversalValenceEncoder()
      : corner_table_(nullptr),
        prev_symbol_(-1),
        last_corner_(kInvalidCornerIndex),
        num_symbols_(0),
        min_valence_(2),
        max_valence_(7) {}